

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyper_log_log.hxx
# Opt level: O2

uint32_t hll::hyper_log_log<int,_12UL>::count_bits(hash_result value)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar3 = 0;
  if ((value & 1) == 0) {
    bVar6 = (value & 0xfffe) == 0;
    uVar2 = value >> 0x10;
    if (!bVar6) {
      uVar2 = value;
    }
    uVar4 = (uint)bVar6 * 0x10;
    uVar5 = uVar4 | 9;
    uVar1 = uVar2 >> 8;
    if ((char)uVar2 != '\0') {
      uVar5 = uVar4 + 1;
      uVar1 = uVar2;
    }
    uVar2 = uVar5 + 4;
    uVar4 = uVar1 >> 4;
    if ((uVar1 & 0xf) != 0) {
      uVar2 = uVar5;
      uVar4 = uVar1;
    }
    uVar5 = uVar2 + 2;
    uVar1 = uVar4 >> 2;
    if ((uVar4 & 3) != 0) {
      uVar5 = uVar2;
      uVar1 = uVar4;
    }
    uVar3 = uVar5 - (uVar1 & 1);
  }
  return uVar3;
}

Assistant:

HLL_CONSTEXPR_OR_INLINE uint32_t hyper_log_log<T, k>::count_bits(hash_result value) noexcept
{
    if ((value & 1u) == 1)
        return 0;

    uint32_t c = 1;
    if ((value & 0xffffu) == 0)
    {
        value >>= 16u;
        c += 16;
    }
    if ((value & 0xffu) == 0)
    {
        value >>= 8u;
        c += 8;
    }
    if ((value & 0xfu) == 0)
    {
        value >>= 4u;
        c += 4;
    }
    if ((value & 0x3u) == 0)
    {
        value >>= 2u;
        c += 2;
    }
    c -= value & 0x1u;

    return c;
}